

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.hpp
# Opt level: O0

Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> __thiscall
rc::shrinkable::walkPath<rc::detail::CaseDescription>
          (shrinkable *this,Shrinkable<rc::detail::CaseDescription> *shrinkable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *path)

{
  Shrinkable<rc::detail::CaseDescription> this_00;
  bool bVar1;
  reference puVar2;
  Shrinkable<rc::detail::CaseDescription> *other;
  undefined8 extraout_RDX;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> MVar3;
  Seq<rc::Shrinkable<rc::detail::CaseDescription>_> local_60;
  undefined1 local_58 [8];
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> s;
  unsigned_long i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  Shrinkable<rc::detail::CaseDescription> current;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *path_local;
  Shrinkable<rc::detail::CaseDescription> *shrinkable_local;
  
  current.m_impl = (IShrinkableImpl *)path;
  Shrinkable<rc::detail::CaseDescription>::Shrinkable
            ((Shrinkable<rc::detail::CaseDescription> *)&__range2,shrinkable);
  this_00.m_impl = current.m_impl;
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)current.m_impl);
  i = (unsigned_long)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00.m_impl);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&i);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    s._8_8_ = *puVar2;
    Shrinkable<rc::detail::CaseDescription>::shrinks
              ((Shrinkable<rc::detail::CaseDescription> *)&local_60);
    rc::seq::at<rc::Shrinkable<rc::detail::CaseDescription>>((seq *)local_58,&local_60,s._8_8_);
    Seq<rc::Shrinkable<rc::detail::CaseDescription>_>::~Seq(&local_60);
    bVar1 = rc::Maybe::operator_cast_to_bool((Maybe *)local_58);
    if (bVar1) {
      other = Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::operator*
                        ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)local_58);
      Shrinkable<rc::detail::CaseDescription>::operator=
                ((Shrinkable<rc::detail::CaseDescription> *)&__range2,other);
    }
    else {
      Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::Maybe
                ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)this);
    }
    Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::~Maybe
              ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)local_58);
    if (!bVar1) goto LAB_001f03c4;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::Maybe
            ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)this,
             (Shrinkable<rc::detail::CaseDescription> *)&__range2);
LAB_001f03c4:
  Shrinkable<rc::detail::CaseDescription>::~Shrinkable
            ((Shrinkable<rc::detail::CaseDescription> *)&__range2);
  MVar3._8_8_ = extraout_RDX;
  MVar3.m_storage = (Storage)this;
  return MVar3;
}

Assistant:

Maybe<Shrinkable<T>> walkPath(const Shrinkable<T> &shrinkable,
                              const std::vector<std::size_t> &path) {
  auto current = shrinkable;
  for (const auto i : path) {
    auto s = seq::at(current.shrinks(), i);
    if (!s) {
      return Nothing;
    }
    current = std::move(*s);
  }

  return current;
}